

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::DoTraceExecutionMode(FunctionBody *this,char *eventDescription)

{
  Type *this_00;
  code *pcVar1;
  bool bVar2;
  ExecutionMode executionMode;
  LocalFunctionId functionId;
  int iVar3;
  uint uVar4;
  undefined4 *puVar5;
  undefined4 extraout_var;
  char *pcVar6;
  wchar local_98 [4];
  char16 functionIdString [42];
  
  uVar4 = ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
             m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
  functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this);
  bVar2 = Phases::IsEnabled((Phases *)&DAT_01453738,ExecutionModePhase,uVar4,functionId);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1bcf,
                                "(Js::Configuration::Global.flags.Trace.IsEnabled(((Phase::ExecutionModePhase)), ((this)->GetSourceContextId()), ((this)->GetLocalFunctionId())))"
                                ,"PHASE_TRACE(Phase::ExecutionModePhase, this)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  this_00 = &this->executionState;
  FunctionExecutionStateMachine::AssertIsInitialized(this_00);
  iVar3 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
  FunctionProxy::GetDebugNumberSet((FunctionProxy *)this,(wchar (*) [42])local_98);
  executionMode = FunctionExecutionStateMachine::GetExecutionMode(this_00);
  pcVar6 = ExecutionModeName(executionMode);
  uVar4 = GetByteCodeCount(this);
  Output::Print(L"ExecutionMode - function: %s (%s), mode: %S, size: %u, ",
                CONCAT44(extraout_var,iVar3),(wchar (*) [42])local_98,pcVar6,(ulong)uVar4);
  FunctionExecutionStateMachine::PrintLimits(this_00);
  if (eventDescription != (char *)0x0) {
    Output::Print(L", event: %S");
  }
  Output::Print(L"\n");
  Output::Flush();
  return;
}

Assistant:

void FunctionBody::DoTraceExecutionMode(const char *const eventDescription) const
    {
        Assert(PHASE_TRACE(Phase::ExecutionModePhase, this));
        executionState.AssertIsInitialized();

        char16 functionIdString[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
        Output::Print(
            _u("ExecutionMode - ")
                _u("function: %s (%s), ")
                _u("mode: %S, ")
                _u("size: %u, "),
            GetDisplayName(),
                GetDebugNumberSet(functionIdString),
            ExecutionModeName(executionState.GetExecutionMode()),
            GetByteCodeCount());

        executionState.PrintLimits();

        if(eventDescription)
        {
            Output::Print(_u(", event: %S"), eventDescription);
        }

        Output::Print(_u("\n"));
        Output::Flush();
    }